

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

bool __thiscall Rml::Element::ArePseudoClassesSet(Element *this,StringList *pseudo_classes)

{
  pointer pbVar1;
  bool bVar2;
  String *pseudo_class;
  pointer pseudo_class_00;
  
  pseudo_class_00 =
       (pseudo_classes->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (pseudo_classes->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pseudo_class_00 == pbVar1) {
    bVar2 = true;
  }
  else {
    do {
      bVar2 = ElementStyle::IsPseudoClassSet(&this->meta->style,pseudo_class_00);
      if (!bVar2) {
        return bVar2;
      }
      pseudo_class_00 = pseudo_class_00 + 1;
    } while (pseudo_class_00 != pbVar1);
  }
  return bVar2;
}

Assistant:

ElementStyle* Element::GetStyle() const
{
	return &meta->style;
}